

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_moves(m68k_info *info,int size)

{
  uint instruction;
  cs_m68k *op;
  int iVar1;
  uint extension;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  uint in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  m68k_info *in_stack_ffffffffffffffe0;
  m68k_info *info_00;
  
  op = build_init_op(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                     (int)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  instruction = read_imm_16((m68k_info *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  info_00 = (m68k_info *)(op->operands + 1);
  if ((instruction & 0x800) == 0) {
    get_ea_mode_op(info_00,op->operands,instruction,in_stack_ffffffffffffffd0);
    iVar1 = 1;
    if ((instruction & 0x8000) != 0) {
      iVar1 = 9;
    }
    *(uint *)&info_00->code = iVar1 + (instruction >> 0xc & 7);
  }
  else {
    iVar1 = 1;
    if ((instruction & 0x8000) != 0) {
      iVar1 = 9;
    }
    op->operands[0].field_0.reg = iVar1 + (instruction >> 0xc & 7);
    get_ea_mode_op(info_00,op->operands,instruction,in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

static void build_moves(m68k_info *info, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVES, 2, size);
	uint extension = read_imm_16(info);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	if (BIT_B(extension)) {
		op0->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
		get_ea_mode_op(info, op1, info->ir, size);
	} else {
		get_ea_mode_op(info, op0, info->ir, size);
		op1->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
	}
}